

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction_X86.h
# Opt level: O0

void __thiscall x86Argument::x86Argument(x86Argument *this,uint num)

{
  uint num_local;
  x86Argument *this_local;
  
  this->type = argNumber;
  (this->field_1).labelID = num;
  this->ptrBase = rNONE;
  this->ptrIndex = rNONE;
  this->ptrMult = 0;
  this->ptrNum = 0;
  return;
}

Assistant:

explicit x86Argument(unsigned num)
	{
		this->type = argNumber;
		this->num = num;
		this->ptrBase = rNONE;
		this->ptrIndex = rNONE;
		this->ptrMult = 0;
		this->ptrNum = 0;
	}